

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

uint compute_motion_cost(MACROBLOCKD *xd,AV1_COMMON *cm,SUBPEL_MOTION_SEARCH_PARAMS *ms_params,
                        BLOCK_SIZE bsize,MV *this_mv)

{
  int iVar1;
  int iVar2;
  long in_RDX;
  undefined4 *in_RDI;
  aom_variance_fn_ptr_t *vfp;
  int dst_stride;
  uint8_t *dst;
  int src_stride;
  uint8_t *src;
  MSBuffers *ms_buffers;
  SUBPEL_SEARCH_VAR_PARAMS *var_params;
  int mi_col;
  int mi_row;
  uint sse;
  uint mse;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff7c;
  undefined8 in_stack_ffffffffffffffb0;
  BUFFER_SET *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffe0;
  
  uVar3 = 0;
  av1_enc_build_inter_predictor
            ((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (MACROBLOCKD *)CONCAT44(*in_RDI,in_RDI[1]),
             (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),(int)in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8,(BLOCK_SIZE)((ulong)in_stack_ffffffffffffffb0 >> 0x38),
             in_stack_ffffffffffffffe0,(int)in_RDX);
  iVar1 = (**(code **)(*(long *)(in_RDX + 0x58) + 0x18))
                    (*(undefined8 *)(in_RDI + 8),in_RDI[0xe],**(undefined8 **)(in_RDX + 0x70),
                     *(undefined4 *)(*(long *)(in_RDX + 0x70) + 0x18),&stack0xffffffffffffffd0);
  iVar2 = mv_err_cost_((MV *)CONCAT44(in_stack_ffffffffffffff7c,uVar3),(MV_COST_PARAMS *)0x263d5b);
  return iVar2 + iVar1;
}

Assistant:

static inline unsigned int compute_motion_cost(
    MACROBLOCKD *xd, const AV1_COMMON *const cm,
    const SUBPEL_MOTION_SEARCH_PARAMS *ms_params, BLOCK_SIZE bsize,
    const MV *this_mv) {
  unsigned int mse;
  unsigned int sse;
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;

  av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, NULL, bsize,
                                AOM_PLANE_Y, AOM_PLANE_Y);

  const SUBPEL_SEARCH_VAR_PARAMS *var_params = &ms_params->var_params;
  const MSBuffers *ms_buffers = &var_params->ms_buffers;

  const uint8_t *const src = ms_buffers->src->buf;
  const int src_stride = ms_buffers->src->stride;
  const uint8_t *const dst = xd->plane[0].dst.buf;
  const int dst_stride = xd->plane[0].dst.stride;
  const aom_variance_fn_ptr_t *vfp = ms_params->var_params.vfp;

  mse = vfp->vf(dst, dst_stride, src, src_stride, &sse);
  mse += mv_err_cost_(this_mv, &ms_params->mv_cost_params);
  return mse;
}